

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  d_derived_tbl *pdVar2;
  jpeg_source_mgr *pjVar3;
  bool bVar4;
  boolean bVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint unaff_R12D;
  uint uVar9;
  int iVar10;
  int bits_left;
  int iVar11;
  int iVar12;
  _func_void_j_decompress_ptr *p_Var13;
  _func_void_j_decompress_ptr *get_buffer;
  bitread_working_state br_state;
  savable_state state;
  bitread_working_state local_a0;
  j_decompress_ptr local_78;
  int local_6c;
  jpeg_entropy_decoder *local_68;
  JBLOCKROW local_60;
  undefined8 local_58;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Stack_50;
  undefined4 local_48;
  JBLOCKROW *local_38;
  
  local_38 = MCU_data;
  pjVar1 = cinfo->entropy;
  local_78 = cinfo;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar5 = process_restart(cinfo), bVar5 != 0)) {
    local_68 = pjVar1;
    if (*(int *)((long)&pjVar1[3].start_pass + 4) == 0) {
      local_a0.cinfo = local_78;
      local_a0.next_input_byte = local_78->src->next_input_byte;
      local_a0.bytes_in_buffer = local_78->src->bytes_in_buffer;
      get_buffer = pjVar1[1].start_pass;
      bits_left = *(int *)&pjVar1[1].decode_mcu;
      local_48 = *(undefined4 *)&pjVar1[3].start_pass;
      local_58 = pjVar1[2].start_pass;
      p_Stack_50 = pjVar1[2].decode_mcu;
      if (0 < local_78->blocks_in_MCU) {
        lVar8 = 0;
        do {
          local_60 = local_38[lVar8];
          pdVar2 = (d_derived_tbl *)(&local_68[10].decode_mcu)[lVar8];
          if (bits_left < 8) {
            bVar4 = false;
            bVar5 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar5 != 0) {
              iVar10 = 1;
              get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
              bits_left = local_a0.bits_left;
              if (7 < local_a0.bits_left) goto LAB_00285c63;
              goto LAB_00285c93;
            }
          }
          else {
LAB_00285c63:
            uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (pdVar2->look_nbits[uVar6] == 0) {
              iVar10 = 9;
LAB_00285c93:
              unaff_R12D = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,
                                            iVar10);
              if ((int)unaff_R12D < 0) {
                unaff_R12D = 0xffffffff;
                bVar4 = false;
              }
              else {
                bVar4 = true;
                get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                bits_left = local_a0.bits_left;
              }
            }
            else {
              unaff_R12D = (uint)pdVar2->look_sym[uVar6];
              bVar4 = true;
              bits_left = bits_left - pdVar2->look_nbits[uVar6];
            }
          }
          if (bVar4) {
            pdVar2 = (d_derived_tbl *)(&local_68[0xf].decode_mcu)[lVar8];
            local_6c = *(int *)((long)&local_68[0x14].decode_mcu + lVar8 * 4);
            if (local_6c == 0) {
              iVar10 = 1;
              if (unaff_R12D == 0) {
                unaff_R12D = 0;
              }
              else {
                p_Var13 = get_buffer;
                iVar12 = bits_left;
                if ((bits_left < (int)unaff_R12D) &&
                   (bVar5 = jpeg_fill_bit_buffer
                                      (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                   p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                   iVar12 = local_a0.bits_left, bVar5 == 0)) {
LAB_0028600f:
                  bVar4 = false;
                  goto LAB_0028602f;
                }
                bits_left = iVar12 - unaff_R12D;
                get_buffer = p_Var13;
              }
            }
            else {
              if (unaff_R12D == 0) {
                iVar10 = 0;
              }
              else {
                p_Var13 = get_buffer;
                iVar10 = bits_left;
                if ((bits_left < (int)unaff_R12D) &&
                   (bVar5 = jpeg_fill_bit_buffer
                                      (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                   p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                   iVar10 = local_a0.bits_left, bVar5 == 0)) {
                  bVar4 = false;
                  goto LAB_0028602f;
                }
                bits_left = iVar10 - unaff_R12D;
                uVar9 = (uint)((long)p_Var13 >> ((byte)bits_left & 0x3f)) & bmask[(int)unaff_R12D];
                uVar7 = bmask[(int)unaff_R12D];
                if (jpeg_zigzag_order[7][(long)(int)unaff_R12D + 7] < (int)uVar9) {
                  uVar7 = 0;
                }
                iVar10 = uVar9 - uVar7;
                get_buffer = p_Var13;
              }
              unaff_R12D = iVar10 + *(int *)((long)&local_58 +
                                            (long)local_78->MCU_membership[lVar8] * 4 + 4);
              *(uint *)((long)&local_58 + (long)local_78->MCU_membership[lVar8] * 4 + 4) =
                   unaff_R12D;
              (*local_60)[0] = (JCOEF)unaff_R12D;
              iVar10 = 1;
              if (1 < local_6c) {
                iVar10 = 1;
                do {
                  if (bits_left < 8) {
                    bVar4 = false;
                    bVar5 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
                    if (bVar5 != 0) {
                      iVar12 = 1;
                      get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                      bits_left = local_a0.bits_left;
                      if (7 < local_a0.bits_left) goto LAB_00285e06;
                      goto LAB_00285e37;
                    }
                  }
                  else {
LAB_00285e06:
                    uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                    if (pdVar2->look_nbits[uVar6] == 0) {
                      iVar12 = 9;
LAB_00285e37:
                      unaff_R12D = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,
                                                    pdVar2,iVar12);
                      if ((int)unaff_R12D < 0) {
                        unaff_R12D = 0xffffffff;
                        bVar4 = false;
                      }
                      else {
                        bVar4 = true;
                        get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                        bits_left = local_a0.bits_left;
                      }
                    }
                    else {
                      unaff_R12D = (uint)pdVar2->look_sym[uVar6];
                      bVar4 = true;
                      bits_left = bits_left - pdVar2->look_nbits[uVar6];
                    }
                  }
                  if (!bVar4) goto LAB_0028600f;
                  iVar12 = (int)unaff_R12D >> 4;
                  uVar7 = unaff_R12D & 0xf;
                  unaff_R12D = unaff_R12D & 0xf;
                  if (uVar7 == 0) {
                    if (iVar12 != 0xf) {
                      bVar4 = true;
                      unaff_R12D = 0;
                      goto LAB_0028602f;
                    }
                    iVar10 = iVar10 + 0xf;
                    unaff_R12D = 0;
                  }
                  else {
                    p_Var13 = get_buffer;
                    iVar11 = bits_left;
                    if ((bits_left < (int)unaff_R12D) &&
                       (bVar5 = jpeg_fill_bit_buffer
                                          (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                       p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                       iVar11 = local_a0.bits_left, bVar5 == 0)) goto LAB_0028600f;
                    bits_left = iVar11 - unaff_R12D;
                    iVar10 = iVar10 + iVar12;
                    uVar7 = bmask[unaff_R12D];
                    uVar9 = (uint)((long)p_Var13 >> ((byte)bits_left & 0x3f)) & uVar7;
                    if (bmask[unaff_R12D - 1] < (int)uVar9) {
                      uVar7 = 0;
                    }
                    unaff_R12D = uVar9 - uVar7;
                    (*local_60)[jpeg_natural_order[iVar10]] = (JCOEF)unaff_R12D;
                    get_buffer = p_Var13;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < local_6c);
              }
            }
            for (; iVar10 < 0x40; iVar10 = iVar10 + iVar12 + 1) {
              if (bits_left < 8) {
                bVar4 = false;
                bVar5 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
                if (bVar5 != 0) {
                  iVar12 = 1;
                  get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                  bits_left = local_a0.bits_left;
                  if (7 < local_a0.bits_left) goto LAB_00285f53;
                  goto LAB_00285f84;
                }
              }
              else {
LAB_00285f53:
                uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                if (pdVar2->look_nbits[uVar6] == 0) {
                  iVar12 = 9;
LAB_00285f84:
                  unaff_R12D = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,
                                                iVar12);
                  if ((int)unaff_R12D < 0) {
                    unaff_R12D = 0xffffffff;
                    bVar4 = false;
                  }
                  else {
                    bVar4 = true;
                    get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                    bits_left = local_a0.bits_left;
                  }
                }
                else {
                  unaff_R12D = (uint)pdVar2->look_sym[uVar6];
                  bVar4 = true;
                  bits_left = bits_left - pdVar2->look_nbits[uVar6];
                }
              }
              if (!bVar4) goto LAB_0028600f;
              iVar12 = (int)unaff_R12D >> 4;
              uVar7 = unaff_R12D & 0xf;
              unaff_R12D = unaff_R12D & 0xf;
              if (uVar7 == 0) {
                if (iVar12 != 0xf) {
                  unaff_R12D = 0;
                  break;
                }
                iVar12 = 0xf;
              }
              else {
                p_Var13 = get_buffer;
                iVar11 = bits_left;
                if ((bits_left < (int)unaff_R12D) &&
                   (bVar5 = jpeg_fill_bit_buffer
                                      (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                   p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                   iVar11 = local_a0.bits_left, bVar5 == 0)) goto LAB_0028600f;
                bits_left = iVar11 - unaff_R12D;
                get_buffer = p_Var13;
              }
            }
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
LAB_0028602f:
          if (!bVar4) {
            return 0;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_78->blocks_in_MCU);
      }
      pjVar3 = local_78->src;
      pjVar3->next_input_byte = local_a0.next_input_byte;
      pjVar3->bytes_in_buffer = local_a0.bytes_in_buffer;
      local_68[1].start_pass = get_buffer;
      *(int *)&local_68[1].decode_mcu = bits_left;
      *(undefined4 *)&local_68[3].start_pass = local_48;
      local_68[2].start_pass = local_58;
      local_68[2].decode_mcu = p_Stack_50;
    }
    *(int *)&local_68[3].decode_mcu = *(int *)&local_68[3].decode_mcu + -1;
    bVar5 = 1;
  }
  else {
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}